

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf.cc
# Opt level: O3

iterator * __thiscall pstack::Elf::Notes::iterator::operator++(iterator *this)

{
  long lVar1;
  Elf64_Phdr *pEVar2;
  ulong uVar3;
  long lVar4;
  Off offset;
  
  lVar1 = (ulong)(this->curNote).n_namesz + this->offset;
  uVar3 = (ulong)((int)lVar1 + 0xcU & 3);
  lVar4 = 4 - uVar3;
  if (uVar3 == 0) {
    lVar4 = 0;
  }
  lVar4 = lVar1 + (ulong)(this->curNote).n_descsz + 0xc + lVar4;
  uVar3 = (ulong)((uint)lVar4 & 3);
  lVar1 = 4 - uVar3;
  if (uVar3 == 0) {
    lVar1 = 0;
  }
  offset = lVar1 + lVar4;
  pEVar2 = (this->phdrsi)._M_current;
  if (offset < pEVar2->p_filesz) {
    this->offset = offset;
  }
  else {
    pEVar2 = pEVar2 + 1;
    (this->phdrsi)._M_current = pEVar2;
    if (pEVar2 == (Elf64_Phdr *)
                  (this->phdrs->super__Vector_base<Elf64_Phdr,_std::allocator<Elf64_Phdr>_>)._M_impl
                  .super__Vector_impl_data._M_finish) {
      this->offset = 0;
      return this;
    }
    startSection(this);
    offset = this->offset;
  }
  Reader::readObj<Elf64_Nhdr>
            ((this->io).super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             offset,&this->curNote,1);
  return this;
}

Assistant:

Notes::iterator &Notes::iterator::operator++()
{
    auto newOff = offset;
    newOff += sizeof curNote + curNote.n_namesz;
    newOff = roundup2(newOff, 4);
    newOff += curNote.n_descsz;
    newOff = roundup2(newOff, 4);
    if (newOff >= phdrsi->p_filesz) {
        if (++phdrsi == phdrs.end()) {
            offset = 0;
            return *this;
        }
        startSection();
    } else {
        offset = newOff;
    }
    readNote();
    return *this;
}